

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<1536,Blob<224>>
               (hashfunc<Blob<224>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  pfHash p_Var4;
  size_type sVar5;
  byte in_CL;
  byte in_DL;
  char *pcVar6;
  uint in_ESI;
  undefined8 in_RDI;
  byte in_R8B;
  byte in_R9B;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *unaff_retaddr;
  bool result;
  Blob<224> h;
  keytype k;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  undefined4 in_stack_fffffffffffffeec;
  byte bVar7;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_fffffffffffffef0;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_ffffffffffffff00;
  Blob<1536> *in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff17;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  pfHash in_stack_ffffffffffffff20;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [3];
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar6 = "exactly";
  if ((in_DL & 1) != 0) {
    pcVar6 = "up to";
  }
  _local_8 = in_RDI;
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x600,pcVar6,(ulong)in_ESI);
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::vector
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)0x18425f);
  Blob<1536>::Blob((Blob<1536> *)&stack0xffffffffffffff18);
  memset(&stack0xffffffffffffff18,0,0xc0);
  if ((local_d & 1) != 0) {
    Blob<224>::Blob((Blob<224> *)&stack0xfffffffffffffef0);
    p_Var4 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var4)(&stack0xffffffffffffff18,0xc0,0,&stack0xfffffffffffffef0);
    std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::push_back
              (in_stack_fffffffffffffef0,(value_type *)CONCAT44(in_stack_fffffffffffffeec,in_ESI));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<1536>,Blob<224>>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
             (bool)in_stack_ffffffffffffff17,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  sVar5 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::size(&local_28);
  printf("%d keys\n",sVar5 & 0xffffffff);
  uVar2 = _local_8;
  bVar7 = 1;
  uVar1 = (ulong)_local_8 >> 0x38;
  bVar3 = TestHashList<Blob<224>>
                    (unaff_retaddr,SUB81(uVar1,0),SUB81((ulong)uVar2 >> 0x30,0),
                     SUB81((ulong)uVar2 >> 0x28,0),SUB81((ulong)uVar2 >> 0x20,0),
                     SUB81((ulong)uVar2 >> 0x18,0));
  bVar7 = bVar3 & bVar7;
  printf("\n");
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::~vector(in_stack_fffffffffffffef0);
  return (bool)(bVar7 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}